

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

void cfd::capi::CfdCapiManager::FreeAllList
               (vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
                *list)

{
  pointer ppCVar1;
  iterator __begin3;
  pointer ppCVar2;
  
  if (list != (vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
               *)0x0) {
    ppCVar2 = (list->
              super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppCVar1 = (list->
              super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar2 != ppCVar1) {
      for (; ppCVar2 != ppCVar1; ppCVar2 = ppCVar2 + 1) {
        free(*ppCVar2);
      }
      ppCVar2 = (list->
                super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((list->
          super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppCVar2) {
        (list->
        super__Vector_base<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = ppCVar2;
      }
    }
  }
  return;
}

Assistant:

void CfdCapiManager::FreeAllList(std::vector<CfdCapiHandleData*>* list) {
  if ((list != nullptr) && (!list->empty())) {
    for (CfdCapiHandleData* handle : *list) {
      ::free(handle);
    }
    list->clear();
  }
}